

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

void __thiscall chrono::viper::Viper::Viper(Viper *this,ChSystem *system,ViperWheelType wheel_type)

{
  shared_ptr<chrono::ChMaterialSurface> local_50;
  shared_ptr<chrono::ChMaterialSurface> local_40 [2];
  ChContactMethod local_20;
  ViperWheelType local_1c;
  ChContactMethod contact_method;
  ViperWheelType wheel_type_local;
  ChSystem *system_local;
  Viper *this_local;
  
  this->m_system = system;
  this->m_chassis_fixed = false;
  local_1c = wheel_type;
  _contact_method = system;
  system_local = (ChSystem *)this;
  std::shared_ptr<chrono::viper::ViperChassis>::shared_ptr(&this->m_chassis);
  std::array<std::shared_ptr<chrono::viper::ViperWheel>,_4UL>::array(&this->m_wheels);
  std::array<std::shared_ptr<chrono::viper::ViperUpperArm>,_4UL>::array(&this->m_upper_arms);
  std::array<std::shared_ptr<chrono::viper::ViperLowerArm>,_4UL>::array(&this->m_lower_arms);
  std::array<std::shared_ptr<chrono::viper::ViperUpright>,_4UL>::array(&this->m_uprights);
  std::array<std::shared_ptr<chrono::ChBody>,_4UL>::array(&this->m_steering_rods);
  std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_4UL>::array(&this->m_drive_motors);
  std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_4UL>::array(&this->m_steer_motors);
  std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_4UL>::array(&this->m_lift_motors);
  std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_4UL>::array(&this->m_drive_motor_funcs);
  std::array<std::shared_ptr<chrono::ChFunction_Const>,_4UL>::array(&this->m_steer_motor_funcs);
  std::array<std::shared_ptr<chrono::ChFunction_Const>,_4UL>::array(&this->m_lift_motor_funcs);
  std::array<std::shared_ptr<chrono::ChLinkTSDA>,_4UL>::array(&this->m_springs);
  std::array<std::shared_ptr<chrono::ChShaft>,_4UL>::array(&this->m_drive_shafts);
  std::shared_ptr<chrono::viper::ViperDriver>::shared_ptr(&this->m_driver);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_default_material);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_wheel_material);
  local_20 = (**(code **)(*(long *)this->m_system + 0x178))();
  if (local_20 == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
  }
  DefaultContactMaterial((viper *)local_40,local_20);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_default_material,local_40);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(local_40);
  DefaultContactMaterial((viper *)&local_50,local_20);
  std::shared_ptr<chrono::ChMaterialSurface>::operator=(&this->m_wheel_material,&local_50);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&local_50);
  Create(this,local_1c);
  return;
}

Assistant:

Viper::Viper(ChSystem* system, ViperWheelType wheel_type) : m_system(system), m_chassis_fixed(false) {
    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    auto contact_method = m_system->GetContactMethod();
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials
    m_default_material = DefaultContactMaterial(contact_method);
    m_wheel_material = DefaultContactMaterial(contact_method);

    Create(wheel_type);
}